

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryAdd<Fad<Fad<double>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>::dx
          (value_type *__return_storage_ptr__,
          FadBinaryAdd<Fad<Fad<double>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
          *this,int i)

{
  Fad<Fad<double>_> *pFVar1;
  Fad<double> *pFVar2;
  value_type vStack_48;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> local_28;
  
  pFVar1 = this->left_;
  pFVar2 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pFVar2 = (pFVar1->dx_).ptr_to_data + i;
  }
  FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::dx(&vStack_48,&this->right_->fadexpr_,i);
  local_28.fadexpr_.left_ = pFVar2;
  local_28.fadexpr_.right_ = &vStack_48;
  Fad<double>::Fad<FadBinaryAdd<Fad<double>,Fad<double>>>(__return_storage_ptr__,&local_28);
  Fad<double>::~Fad(&vStack_48);
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}